

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

void __thiscall
cs::compiler_type::preprocessor::process_endline
          (preprocessor *this,context_t *context,compiler_type *compiler,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *tokens,charset *encoding)

{
  string *__rhs;
  iterator *piVar1;
  token_base *ptVar2;
  size_t sVar3;
  element_type *peVar4;
  pointer pcVar5;
  size_type sVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  _Elt_pointer pptVar11;
  exception *peVar12;
  long *plVar13;
  size_type *psVar14;
  size_type __n;
  _Elt_pointer pptVar15;
  char *size;
  deque<char,_std::allocator<char>_> *raw_buff;
  _Elt_pointer pptVar16;
  _Map_pointer ppptVar17;
  string version_str;
  string arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  compiler_type *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  charset *local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210 [3];
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->is_annotation == true) {
    this->is_annotation = false;
    new_empty_line(this,context);
    return;
  }
  if (this->is_command == true) {
    this->is_command = false;
    __rhs = &this->command;
    iVar7 = std::__cxx11::string::compare((char *)__rhs);
    if ((iVar7 == 0) && (this->multi_line == false)) {
      this->multi_line = true;
    }
    else {
      size = "end";
      iVar7 = std::__cxx11::string::compare((char *)__rhs);
      if ((iVar7 == 0) && (this->multi_line == true)) {
        local_260._M_dataplus._M_p =
             (pointer)token_base::operator_new((token_base *)0x10,(size_t)size);
        ((token_base *)local_260._M_dataplus._M_p)->line_num = this->last_line_num;
        ((token_base *)local_260._M_dataplus._M_p)->_vptr_token_base =
             (_func_int **)&PTR__token_base_0025e3a0;
        pptVar16 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                   _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pptVar16 ==
            (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
          _M_push_back_aux<cs::token_base*>
                    ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens,
                     (token_base **)&local_260);
        }
        else {
          *pptVar16 = (token_base *)local_260._M_dataplus._M_p;
          piVar1 = &(tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                    ._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
        this->multi_line = false;
      }
      else {
        local_240 = compiler;
        lVar9 = std::__cxx11::string::find((char)__rhs,0x3a);
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        local_260._M_string_length = 0;
        local_260.field_2._M_local_buf[0] = '\0';
        if (lVar9 != -1) {
          local_218 = encoding;
          std::__cxx11::string::substr((ulong)&local_280,(ulong)__rhs);
          std::__cxx11::string::operator=((string *)&local_260,(string *)&local_280);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != &local_280.field_2) {
            operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::substr((ulong)&local_280,(ulong)__rhs);
          std::__cxx11::string::operator=((string *)__rhs,(string *)&local_280);
          encoding = local_218;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != &local_280.field_2) {
            operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
          }
        }
        iVar7 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar7 == 0) {
          iVar7 = std::__cxx11::string::compare((char *)&local_260);
          compiler = local_240;
          if (iVar7 == 0) {
            *encoding = ascii;
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)&local_260);
            if (iVar7 == 0) {
              *encoding = utf8;
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)&local_260);
              if (iVar7 != 0) {
                peVar12 = (exception *)__cxa_allocate_exception(0x90);
                sVar3 = this->line_num;
                peVar4 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr;
                local_130[0]._M_dataplus._M_p = (pointer)&local_130[0].field_2;
                pcVar5 = (peVar4->file_path)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_130,pcVar5,pcVar5 + (peVar4->file_path)._M_string_length)
                ;
                std::operator+(&local_238,"@",__rhs);
                plVar13 = (long *)std::__cxx11::string::append((char *)&local_238);
                local_280._M_dataplus._M_p = (pointer)*plVar13;
                psVar14 = (size_type *)(plVar13 + 2);
                if ((size_type *)local_280._M_dataplus._M_p == psVar14) {
                  local_280.field_2._M_allocated_capacity = *psVar14;
                  local_280.field_2._8_8_ = plVar13[3];
                  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
                }
                else {
                  local_280.field_2._M_allocated_capacity = *psVar14;
                }
                local_280._M_string_length = plVar13[1];
                *plVar13 = (long)psVar14;
                plVar13[1] = 0;
                *(undefined1 *)(plVar13 + 2) = 0;
                std::operator+(&local_50,&local_280,&local_260);
                local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_150,"Unavailable encoding.","");
                exception::exception(peVar12,sVar3,local_130,&local_50,&local_150);
                __cxa_throw(peVar12,&exception::typeinfo,exception::~exception);
              }
              *encoding = gbk;
            }
          }
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)__rhs);
          if (iVar7 != 0) {
            peVar12 = (exception *)__cxa_allocate_exception(0x90);
            sVar3 = this->line_num;
            peVar4 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
            pcVar5 = (peVar4->file_path)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_190,pcVar5,pcVar5 + (peVar4->file_path)._M_string_length);
            std::operator+(&local_280,"@",__rhs);
            if (local_260._M_string_length == 0) {
              local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
            }
            else {
              std::operator+(&local_238,": ",&local_260);
            }
            std::operator+(&local_f0,&local_280,&local_238);
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1b0,"Wrong grammar for preprocessor command.","");
            exception::exception(peVar12,sVar3,&local_190,&local_f0,&local_1b0);
            __cxa_throw(peVar12,&exception::typeinfo,exception::~exception);
          }
          local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"210508","");
          sVar6 = local_260._M_string_length;
          __n = local_260._M_string_length;
          if (local_280._M_string_length < local_260._M_string_length) {
            __n = local_280._M_string_length;
          }
          if (__n == 0) {
            uVar10 = 0;
          }
          else {
            uVar8 = memcmp(local_260._M_dataplus._M_p,local_280._M_dataplus._M_p,__n);
            uVar10 = (ulong)uVar8;
          }
          compiler = local_240;
          if ((int)uVar10 == 0) {
            uVar10 = 0xffffffff80000000;
            if (-0x80000000 < (long)(sVar6 - local_280._M_string_length)) {
              uVar10 = sVar6 - local_280._M_string_length;
            }
            if (0x7ffffffe < (long)uVar10) {
              uVar10 = 0x7fffffff;
            }
          }
          if (0 < (int)uVar10) {
            peVar12 = (exception *)__cxa_allocate_exception(0x90);
            sVar3 = this->line_num;
            peVar4 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            pcVar5 = (peVar4->file_path)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_170,pcVar5,pcVar5 + (peVar4->file_path)._M_string_length);
            std::operator+(&local_90,"@",__rhs);
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_90);
            local_238._M_dataplus._M_p = (pointer)*plVar13;
            psVar14 = (size_type *)(plVar13 + 2);
            if ((size_type *)local_238._M_dataplus._M_p == psVar14) {
              local_238.field_2._M_allocated_capacity = *psVar14;
              local_238.field_2._8_8_ = plVar13[3];
              local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
            }
            else {
              local_238.field_2._M_allocated_capacity = *psVar14;
            }
            local_238._M_string_length = plVar13[1];
            *plVar13 = (long)psVar14;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            std::operator+(&local_70,&local_238,&local_260);
            std::operator+(&local_d0,"Newer Language Standard required: ",&local_260);
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_d0);
            local_210[0]._M_dataplus._M_p = (pointer)*plVar13;
            psVar14 = (size_type *)(plVar13 + 2);
            if ((size_type *)local_210[0]._M_dataplus._M_p == psVar14) {
              local_210[0].field_2._0_8_ = *psVar14;
              local_210[0].field_2._8_8_ = plVar13[3];
              local_210[0]._M_dataplus._M_p = (pointer)&local_210[0].field_2;
            }
            else {
              local_210[0].field_2._0_8_ = *psVar14;
            }
            local_210[0]._M_string_length = plVar13[1];
            *plVar13 = (long)psVar14;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            std::operator+(&local_b0,local_210,&local_280);
            exception::exception(peVar12,sVar3,&local_170,&local_70,&local_b0);
            __cxa_throw(peVar12,&exception::typeinfo,exception::~exception);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != &local_280.field_2) {
            operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,
                          CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                   local_260.field_2._M_local_buf[0]) + 1);
        }
      }
    }
    (this->command)._M_string_length = 0;
    *(this->command)._M_dataplus._M_p = '\0';
  }
  if (this->empty_buff == true) {
    new_empty_line(this,context);
  }
  else {
    raw_buff = &this->buff;
    local_240 = (compiler_type *)raw_buff;
    process_char_buff(compiler,raw_buff,tokens,*encoding);
    pptVar16 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar16 !=
        (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      pptVar15 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_first;
      ppptVar17 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_node;
      do {
        pptVar11 = pptVar16;
        if (pptVar16 == pptVar15) {
          pptVar11 = ppptVar17[-1] + 0x40;
        }
        if (pptVar11[-1] != (token_base *)0x0) {
          pptVar11 = pptVar16;
          if (pptVar16 == pptVar15) {
            pptVar11 = ppptVar17[-1] + 0x40;
          }
          ptVar2 = pptVar11[-1];
          iVar7 = (*ptVar2->_vptr_token_base[2])(ptVar2);
          if (iVar7 == 1) break;
          ptVar2->line_num = this->line_num;
        }
        if (pptVar16 == pptVar15) {
          pptVar15 = ppptVar17[-1];
          ppptVar17 = ppptVar17 + -1;
          pptVar16 = pptVar15 + 0x40;
        }
        pptVar16 = pptVar16 + -1;
      } while (pptVar16 !=
               (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    if (this->multi_line == false) {
      local_260._M_dataplus._M_p =
           (pointer)token_base::operator_new((token_base *)0x10,(size_t)raw_buff);
      ((token_base *)local_260._M_dataplus._M_p)->line_num = this->line_num;
      ((token_base *)local_260._M_dataplus._M_p)->_vptr_token_base =
           (_func_int **)&PTR__token_base_0025e3a0;
      pptVar16 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pptVar16 ==
          (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
          super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
        _M_push_back_aux<cs::token_base*>
                  ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens,
                   (token_base **)&local_260);
      }
      else {
        *pptVar16 = (token_base *)local_260._M_dataplus._M_p;
        piVar1 = &(tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
    }
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                ->file_buff,&this->line);
    sVar3 = this->line_num;
    this->line_num = sVar3 + 1;
    this->last_line_num = sVar3;
    std::deque<char,_std::allocator<char>_>::clear((deque<char,_std::allocator<char>_> *)local_240);
    (this->line)._M_string_length = 0;
    *(this->line)._M_dataplus._M_p = '\0';
    this->empty_buff = true;
    this->empty_line = true;
  }
  return;
}

Assistant:

void process_endline(const context_t &context, compiler_type &compiler, std::deque<token_base *> &tokens,
		                     charset &encoding)
		{
			if (is_annotation) {
				is_annotation = false;
				new_empty_line(context);
				return;
			}
			if (is_command) {
				is_command = false;
				if (command == "begin" && !multi_line)
					multi_line = true;
				else if (command == "end" && multi_line) {
					tokens.push_back(new token_endline(last_line_num));
					multi_line = false;
				}
				else {
					auto pos = command.find(':');
					std::string arg;
					if (pos != std::string::npos) {
						arg = command.substr(pos + 1);
						command = command.substr(0, pos);
					}
					if (command == "charset") {
						if (arg == "ascii")
							encoding = charset::ascii;
						else if (arg == "utf8")
							encoding = charset::utf8;
						else if (arg == "gbk")
							encoding = charset::gbk;
						else
							throw exception(line_num, context->file_path, "@" + command + ": " + arg,
							                "Unavailable encoding.");
					}
					else if (command == "require") {
						std::string version_str = CS_GET_VERSION_STR(COVSCRIPT_STD_VERSION);
						if (arg > version_str)
							throw exception(line_num, context->file_path, "@" + command + ": " + arg,
							                "Newer Language Standard required: " + arg + ", now on " + version_str);
					}
					else
						throw exception(line_num, context->file_path, "@" + command + (arg.empty() ? "" : ": " + arg),
						                "Wrong grammar for preprocessor command.");
				}
				command.clear();
			}
			if (empty_buff) {
				new_empty_line(context);
				return;
			}
			try {
				compiler.process_char_buff(buff, tokens, encoding);
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(line_num, context->file_path, line, e.what());
			}
			for (auto it = tokens.rbegin(); it != tokens.rend(); ++it) {
				if (*it != nullptr) {
					token_base *ptr = *it;
					if (ptr->get_type() == token_types::endline)
						break;
					else
						ptr->line_num = line_num;
				}
			}
			if (!multi_line)
				tokens.push_back(new token_endline(line_num));
			context->file_buff.emplace_back(line);
			last_line_num = line_num++;
			buff.clear();
			line.clear();
			empty_buff = true;
			empty_line = true;
		}